

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O3

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMask
          (BlendMaskStateMachine *this,GLboolean r,GLboolean g,GLboolean b,GLboolean a)

{
  pointer pBVar1;
  GLboolean *pGVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  (*this->gl->colorMask)(r,g,b,a);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->state).
                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1;
  if (lVar3 != 0) {
    pGVar2 = &pBVar1->mask_a;
    uVar4 = 1;
    do {
      pGVar2[-3] = r;
      pGVar2[-2] = g;
      pGVar2[-1] = b;
      *pGVar2 = a;
      uVar5 = (ulong)uVar4;
      pGVar2 = pGVar2 + 0x20;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)(lVar3 >> 5));
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMask(glw::GLboolean r, glw::GLboolean g, glw::GLboolean b,
																 glw::GLboolean a)
{
	// all draw buffers
	gl.colorMask(r, g, b, a);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].mask_r = r;
		state[i].mask_g = g;
		state[i].mask_b = b;
		state[i].mask_a = a;
	}
}